

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void __thiscall
Search::push_at<Search::action_repr>
          (Search *this,v_array<Search::action_repr> *v,action_repr item,size_t pos)

{
  long lVar1;
  features *pfVar2;
  features *pfVar3;
  long lVar4;
  
  pfVar2 = item.repr;
  lVar1 = *(long *)this;
  pfVar3 = (features *)((long)*(void **)(this + 8) - lVar1 >> 4);
  if (pfVar2 < pfVar3) {
    *(int *)(lVar1 + (long)pfVar2 * 0x10) = (int)v;
    *(long *)(lVar1 + 8 + (long)pfVar2 * 0x10) = item._0_8_;
  }
  else {
    lVar4 = (long)pfVar2 * 0x10;
    if ((ulong)(lVar1 + lVar4) < *(ulong *)(this + 0x10)) {
      memset(*(void **)(this + 8),0,((long)pfVar2 - (long)pfVar3) * 0x10);
    }
    else {
      v_array<Search::action_repr>::resize
                ((v_array<Search::action_repr> *)this,(long)pfVar2 * 2 + 3);
    }
    lVar1 = *(long *)this;
    *(int *)(lVar1 + lVar4) = (int)v;
    *(long *)(lVar1 + 8 + lVar4) = item._0_8_;
    *(long *)(this + 8) = *(long *)this + lVar4 + 0x10;
  }
  return;
}

Assistant:

void push_at(v_array<T>& v, T item, size_t pos)
{
  if (v.size() > pos)
    v.begin()[pos] = item;
  else
  {
    if (v.end_array > v.begin() + pos)
    {
      // there's enough memory, just not enough filler
      memset(v.end(), 0, sizeof(T) * (pos - v.size()));
      v.begin()[pos] = item;
      v.end() = v.begin() + pos + 1;
    }
    else
    {
      // there's not enough memory
      v.resize(2 * pos + 3);
      v.begin()[pos] = item;
      v.end() = v.begin() + pos + 1;
    }
  }
}